

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeDependencies.cpp
# Opt level: O2

bool __thiscall helics::TimeDependencies::hasActiveTimeDependencies(TimeDependencies *this)

{
  pointer pDVar1;
  long lVar2;
  long lVar3;
  pointer pDVar4;
  pointer pDVar5;
  pointer pDVar6;
  
  pDVar6 = (this->dependencies).
           super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pDVar1 = (this->dependencies).
           super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  lVar3 = (long)pDVar1 - (long)pDVar6;
  pDVar6 = pDVar6 + 2;
  for (lVar2 = lVar3 / 0x58 >> 2; 0 < lVar2; lVar2 = lVar2 + -1) {
    if (((pDVar6[-2].dependency == true) && (pDVar6[-2].fedID.gid - 0x20000U < 0x6ffe0000)) &&
       (pDVar6[-2].super_TimeData.next.internalTimeCode != 0x7fffffffffffffff)) {
      pDVar5 = pDVar6 + -2;
      goto LAB_002e74dc;
    }
    if (((pDVar6[-1].dependency == true) && (pDVar6[-1].fedID.gid - 0x20000U < 0x6ffe0000)) &&
       (pDVar6[-1].super_TimeData.next.internalTimeCode != 0x7fffffffffffffff)) {
      pDVar5 = pDVar6 + -1;
      goto LAB_002e74dc;
    }
    if (((pDVar6->dependency == true) && ((pDVar6->fedID).gid - 0x20000U < 0x6ffe0000)) &&
       (pDVar5 = pDVar6, (pDVar6->super_TimeData).next.internalTimeCode != 0x7fffffffffffffff))
    goto LAB_002e74dc;
    if (((pDVar6[1].dependency == true) && (pDVar6[1].fedID.gid - 0x20000U < 0x6ffe0000)) &&
       (pDVar6[1].super_TimeData.next.internalTimeCode != 0x7fffffffffffffff)) {
      pDVar5 = pDVar6 + 1;
      goto LAB_002e74dc;
    }
    pDVar6 = pDVar6 + 4;
    lVar3 = lVar3 + -0x160;
  }
  lVar3 = lVar3 / 0x58;
  pDVar4 = pDVar6 + -2;
  if (lVar3 != 1) {
    if (lVar3 == 3) {
      if (((pDVar6[-2].dependency == true) && (pDVar6[-2].fedID.gid - 0x20000U < 0x6ffe0000)) &&
         (pDVar5 = pDVar4, (pDVar4->super_TimeData).next.internalTimeCode != 0x7fffffffffffffff))
      goto LAB_002e74dc;
      pDVar4 = pDVar6 + -1;
    }
    else {
      pDVar5 = pDVar1;
      if (lVar3 != 2) goto LAB_002e74dc;
    }
    if (((pDVar4->dependency == true) && ((pDVar4->fedID).gid - 0x20000U < 0x6ffe0000)) &&
       (pDVar5 = pDVar4, (pDVar4->super_TimeData).next.internalTimeCode != 0x7fffffffffffffff))
    goto LAB_002e74dc;
    pDVar4 = pDVar4 + 1;
  }
  pDVar5 = pDVar1;
  if (((pDVar4->dependency == true) && ((pDVar4->fedID).gid - 0x20000U < 0x6ffe0000)) &&
     (pDVar5 = pDVar4, (pDVar4->super_TimeData).next.internalTimeCode == 0x7fffffffffffffff)) {
    pDVar5 = pDVar1;
  }
LAB_002e74dc:
  return pDVar5 != pDVar1;
}

Assistant:

bool TimeDependencies::hasActiveTimeDependencies() const
{
    return std::any_of(dependencies.begin(), dependencies.end(), [](const auto& dep) {
        return (dep.dependency && (dep.fedID.isFederate()) && (dep.next < cBigTime));
    });
}